

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_dir.cpp
# Opt level: O0

bool IsTrDosDirSector(Sector *sector)

{
  bool bVar1;
  int iVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  ulong local_38;
  size_t entry;
  TRDOS_DIR *pd;
  unsigned_long dir_entries;
  Data *data;
  Sector *sector_local;
  
  this = &Sector::data_copy(sector,0)->super_vector<unsigned_char,_std::allocator<unsigned_char>_>;
  if (((sector->header).sector == 1) && ((sector->header).size == 1)) {
    iVar2 = Sector::size(sector);
    entry = (size_t)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this);
    for (local_38 = 0; local_38 < (ulong)(long)iVar2 >> 4; local_38 = local_38 + 1) {
      bVar1 = IsTrDosDirEntry((TRDOS_DIR *)entry);
      if (!bVar1) {
        return false;
      }
      entry = entry + 0x10;
    }
    sector_local._7_1_ = true;
  }
  else {
    sector_local._7_1_ = false;
  }
  return sector_local._7_1_;
}

Assistant:

bool IsTrDosDirSector(const Sector& sector)
{
    auto& data = sector.data_copy();

    // Check sector number and size
    if (sector.header.sector != 1 || sector.header.size != 1)
        return false;

    auto dir_entries = sector.size() / sizeof(TRDOS_DIR);
    auto pd = reinterpret_cast<const TRDOS_DIR*>(data.data());

    for (size_t entry = 0; entry < dir_entries; ++entry, ++pd)
    {
        if (!IsTrDosDirEntry(pd))
            return false;
    }

    return true;
}